

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void inlet_pointer(_inlet *x,t_gpointer *gp)

{
  undefined1 local_28 [8];
  t_atom a;
  t_gpointer *gp_local;
  _inlet *x_local;
  
  a.a_w.w_gpointer = gp;
  if (x->i_symfrom == &s_pointer) {
    pd_vmess(x->i_dest,(x->i_un).iu_symto,"p",gp);
  }
  else if (x->i_symfrom == (t_symbol *)0x0) {
    pd_pointer(x->i_dest,gp);
  }
  else if (x->i_symfrom == &s_list) {
    local_28._0_4_ = A_POINTER;
    a._0_8_ = gp;
    inlet_list(x,&s_pointer,1,(t_atom *)local_28);
  }
  else {
    inlet_wrong(x,&s_pointer);
  }
  return;
}

Assistant:

static void inlet_pointer(t_inlet *x, t_gpointer *gp)
{
    if (x->i_symfrom == &s_pointer)
        pd_vmess(x->i_dest, x->i_symto, "p", gp);
    else if (!x->i_symfrom) pd_pointer(x->i_dest, gp);
    else if (x->i_symfrom == &s_list)
    {
        t_atom a;
        SETPOINTER(&a, gp);
        inlet_list(x, &s_pointer, 1, &a);
    }
    else inlet_wrong(x, &s_pointer);
}